

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldscript.c
# Opt level: O2

int sf_max(GlobalVars *gv,lword addr,lword *res)

{
  long lVar1;
  int *piVar2;
  int abs2;
  int abs1;
  lword val2;
  lword val1;
  int local_40;
  int local_3c;
  long local_38;
  long local_30;
  
  term_two_exp(addr,&local_3c,&local_30,&local_40,&local_38);
  lVar1 = local_38;
  if (local_38 < local_30) {
    lVar1 = local_30;
  }
  *res = lVar1;
  piVar2 = &local_3c;
  if (local_30 < local_38) {
    piVar2 = &local_40;
  }
  return *piVar2;
}

Assistant:

static int sf_max(struct GlobalVars *gv,lword addr,lword *res)
{
  int abs1,abs2;
  lword val1,val2;

  term_two_exp(addr,&abs1,&val1,&abs2,&val2);
  if (val1 < val2) {
    *res = val2;
    return abs2;
  }
  *res = val1;
  return abs1;
}